

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall UDPSplitPacketReader::read(UDPSplitPacketReader *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  read((UDPSplitPacketReader *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),in_ESI,in_RDX,
       in_RCX);
  return;
}

Assistant:

void UDPSplitPacketReader::read(void *buffer, int length) {
  if(receivedPacket) {
    while(length > 0) {
      int currentLength = currentPacket->remaining();
      if (currentLength == 0) {
        currentPacket = currentPacket->next;
        currentLength = currentPacket->remaining();
      }
      if (currentLength < length) {
        if (!currentPacket->hasNext) {
          throw string("UDPSplitPacketReader::read: no more packets to read");
        }
        currentPacket->read(buffer, currentLength);
        buffer = (char *) buffer + currentLength;
        length -= currentLength;
      } else {
        currentPacket->read(buffer, length);
        break;
      }
    }
  } else {
    throw string("UDPSplitPacketReader::read: no packets read");
  }
}